

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskIterator.cpp
# Opt level: O2

void __thiscall
OnDiskIterator::pop(OnDiskIterator *this,int count,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *out)

{
  uint64_t uVar1;
  int iVar2;
  bool bVar3;
  string next;
  ifstream reader;
  byte abStack_218 [488];
  
  DatabaseName::get_full_path_abi_cxx11_((path *)&next,&this->datafile_name);
  std::ifstream::ifstream(&reader,next._M_dataplus._M_p,_S_bin);
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)&next);
  std::istream::seekg(&reader,this->byte_offset,0);
  iVar2 = 0;
  if (0 < count) {
    iVar2 = count;
  }
  while( true ) {
    bVar3 = iVar2 == 0;
    iVar2 = iVar2 + -1;
    if ((bVar3) || ((abStack_218[*(long *)(_reader + -0x18)] & 2) != 0)) goto LAB_00148f56;
    next._M_string_length = 0;
    next.field_2._M_local_buf[0] = '\0';
    next._M_dataplus._M_p = (pointer)&next.field_2;
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&reader,(string *)&next);
    if ((abStack_218[*(long *)(_reader + -0x18)] & 2) != 0) break;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)out,&next);
    this->file_offset = this->file_offset + 1;
    std::__cxx11::string::~string((string *)&next);
  }
  std::__cxx11::string::~string((string *)&next);
LAB_00148f56:
  uVar1 = std::istream::tellg();
  this->byte_offset = uVar1;
  std::ifstream::~ifstream(&reader);
  return;
}

Assistant:

void OnDiskIterator::pop(int count, std::vector<std::string> *out) {
    std::ifstream reader(datafile_name.get_full_path(), std::ios_base::binary);
    reader.seekg(byte_offset);

    for (int i = 0; i < count && !reader.eof(); i++) {
        std::string next;
        std::getline(reader, next);
        if (reader.eof()) {
            break;
        }
        out->emplace_back(next);
        file_offset += 1;
    }
    byte_offset = reader.tellg();
}